

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateMousePosAndButtons(void)

{
  int iVar1;
  double mouse_y;
  double mouse_x;
  bool focused;
  ImVec2 mouse_pos_backup;
  int i;
  ImGuiIO *io;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ImVec2 in_stack_ffffffffffffffc8;
  GLFWwindow *in_stack_ffffffffffffffd0;
  double local_28;
  ImVec2 local_1c;
  ImVec2 local_14;
  int local_c;
  ImGuiIO *local_8;
  
  local_8 = ImGui::GetIO();
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
    if ((g_MouseJustPressed[local_c] & 1U) == 0) {
      iVar1 = glfwGetMouseButton((GLFWwindow *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      in_stack_ffffffffffffffc4 = CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffffc4);
    }
    local_8->MouseDown[local_c] = SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0);
    g_MouseJustPressed[local_c] = false;
  }
  local_14 = local_8->MousePos;
  ImVec2::ImVec2(&local_1c,-3.4028235e+38,-3.4028235e+38);
  local_8->MousePos = local_1c;
  iVar1 = glfwGetWindowAttrib((GLFWwindow *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  if (iVar1 != 0) {
    if ((local_8->WantSetMousePos & 1U) == 0) {
      glfwGetCursorPos(in_stack_ffffffffffffffd0,(double *)in_stack_ffffffffffffffc8,
                       (double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,(float)local_28,
                     (float)(double)in_stack_ffffffffffffffd0);
      local_8->MousePos = in_stack_ffffffffffffffc8;
    }
    else {
      glfwSetCursorPos(in_stack_ffffffffffffffd0,(double)in_stack_ffffffffffffffc8,
                       (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMousePosAndButtons()
{
    // Update buttons
    ImGuiIO& io = ImGui::GetIO();
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        // If a mouse press event came, always pass it as "mouse held this frame", so we don't miss click-release events that are shorter than 1 frame.
        io.MouseDown[i] = g_MouseJustPressed[i] || glfwGetMouseButton(g_Window, i) != 0;
        g_MouseJustPressed[i] = false;
    }

    // Update mouse position
    const ImVec2 mouse_pos_backup = io.MousePos;
    io.MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
#ifdef __EMSCRIPTEN__
    const bool focused = true; // Emscripten
#else
    const bool focused = glfwGetWindowAttrib(g_Window, GLFW_FOCUSED) != 0;
#endif
    if (focused)
    {
        if (io.WantSetMousePos)
        {
            glfwSetCursorPos(g_Window, (double)mouse_pos_backup.x, (double)mouse_pos_backup.y);
        }
        else
        {
            double mouse_x, mouse_y;
            glfwGetCursorPos(g_Window, &mouse_x, &mouse_y);
            io.MousePos = ImVec2((float)mouse_x, (float)mouse_y);
        }
    }
}